

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_448486::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
ArgumentParserWithOutputVariable
          (ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this)

{
  static_string_view name;
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this_local;
  
  CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::CMakePathArgumentParser
            (&this->super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>);
  name = ::cm::operator____s("OUTPUT_VARIABLE",0xf);
  (anonymous_namespace)::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
  Bind<std::optional<ArgumentParser::NonEmpty<std::__cxx11::string>>>
            ((ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *)this,name,
             0x30);
  return;
}

Assistant:

ArgumentParserWithOutputVariable()
    : CMakePathArgumentParser<Result>()
  {
    this->Bind("OUTPUT_VARIABLE"_s, &Result::Output);
  }